

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

Thread * __thiscall re2::NFA::AllocThread(NFA *this)

{
  char **ppcVar1;
  size_t unaff_retaddr;
  Thread *t;
  NFA *this_local;
  
  this_local = (NFA *)this->freelist_;
  if (this_local == (NFA *)0x0) {
    std::deque<re2::NFA::Thread,_std::allocator<re2::NFA::Thread>_>::emplace_back<>(&this->arena_);
    this_local = (NFA *)std::deque<re2::NFA::Thread,_std::allocator<re2::NFA::Thread>_>::back
                                  (&this->arena_);
    ((anon_union_8_2_62753a03_for_Thread_0 *)&this_local->prog_)->ref = 1;
    ppcVar1 = (char **)operator_new__(unaff_retaddr);
    *(char ***)&this_local->start_ = ppcVar1;
  }
  else {
    this->freelist_ = (Thread *)*(anon_union_8_2_62753a03_for_Thread_0 *)&this_local->prog_;
    ((anon_union_8_2_62753a03_for_Thread_0 *)&this_local->prog_)->ref = 1;
  }
  return (Thread *)this_local;
}

Assistant:

NFA::Thread* NFA::AllocThread() {
  Thread* t = freelist_;
  if (t != NULL) {
    freelist_ = t->next;
    t->ref = 1;
    // We don't need to touch t->capture because
    // the caller will immediately overwrite it.
    return t;
  }
  arena_.emplace_back();
  t = &arena_.back();
  t->ref = 1;
  t->capture = new const char*[ncapture_];
  return t;
}